

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_bb7cf9::ReportCheckResult
          (anon_unknown_dwarf_bb7cf9 *this,string_view what,string *result,cmMakefile *mf)

{
  cmake *pcVar1;
  cmMessenger *this_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text;
  undefined1 local_e0 [16];
  string local_d0;
  undefined1 local_b0 [24];
  _Map_pointer ppvStack_98;
  cmAlphaNum local_80;
  undefined1 local_50 [32];
  static_string_view local_30;
  
  pcVar1 = cmMakefile::GetCMakeInstance((cmMakefile *)result);
  if ((pcVar1->CheckInProgressMessages).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (pcVar1->CheckInProgressMessages).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = cmMakefile::GetMessenger((cmMakefile *)result);
    local_b0._0_8_ = (_Elt_pointer)0x8;
    local_b0._8_8_ = "Ignored ";
    local_30.super_string_view._M_len = 0x14;
    local_30.super_string_view._M_str = " without CHECK_START";
    local_80.View_._M_len = (size_t)this;
    local_80.View_._M_str = (char *)what._M_len;
    cmStrCat<cm::static_string_view>
              ((string *)(local_e0 + 0x10),(cmAlphaNum *)(local_e0 + 0x30),&local_80,&local_30);
    cmMakefile::GetBacktrace((cmMakefile *)local_e0);
    cmMessenger::DisplayMessage
              (this_00,AUTHOR_WARNING,(string *)(local_e0 + 0x10),(cmListFileBacktrace *)local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
    this_01 = (string *)(local_e0 + 0x10);
  }
  else {
    pcVar1 = cmMakefile::GetCMakeInstance((cmMakefile *)result);
    cmake::GetTopCheckInProgressMessage_abi_cxx11_((string *)(local_e0 + 0x10),pcVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   (string *)(local_e0 + 0x10)," - ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)what._M_str)
    ;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)(local_e0 + 0x10));
    local_50._0_8_ = local_50 + 0x10;
    if ((_Elt_pointer)local_b0._0_8_ == (_Elt_pointer)(local_b0 + 0x10)) {
      local_50._24_8_ = ppvStack_98;
    }
    else {
      local_50._0_8_ = local_b0._0_8_;
    }
    local_50._8_8_ = local_b0._8_8_;
    local_b0._8_8_ = (_Elt_pointer)0x0;
    local_b0[0x10] = 0;
    local_b0._0_8_ = (_Elt_pointer)(local_b0 + 0x10);
    IndentText((string *)&local_80,(string *)local_50,(cmMakefile *)result);
    cmMakefile::DisplayStatus((cmMakefile *)result,(string *)&local_80,-1.0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)local_50);
    this_01 = (string *)(local_e0 + 0x30);
  }
  std::__cxx11::string::~string(this_01);
  return;
}

Assistant:

void ReportCheckResult(cm::string_view what, std::string result,
                       cmMakefile& mf)
{
  if (mf.GetCMakeInstance()->HasCheckInProgress()) {
    auto text = mf.GetCMakeInstance()->GetTopCheckInProgressMessage() + " - " +
      std::move(result);
    mf.DisplayStatus(IndentText(std::move(text), mf), -1);
  } else {
    mf.GetMessenger()->DisplayMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat("Ignored "_s, what, " without CHECK_START"_s),
      mf.GetBacktrace());
  }
}